

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_writer_end_map(labpack_writer_t *writer)

{
  _Bool _Var1;
  labpack_writer_t *writer_local;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x18e,"void labpack_writer_end_map(labpack_writer_t *)");
  }
  _Var1 = labpack_writer_is_ok(writer);
  if (_Var1) {
    mpack_finish_map(writer->encoder);
    labpack_writer_check_encoder(writer);
  }
  return;
}

Assistant:

void
labpack_writer_end_map(labpack_writer_t* writer)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        mpack_finish_map(writer->encoder);
        labpack_writer_check_encoder(writer);
    }
}